

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tick.cpp
# Opt level: O2

bool P_CheckTickerPaused(void)

{
  if (((gamestate != GS_TITLELEVEL && !netgame) &&
      (((menuactive != MENU_Off && menuactive != MENU_OnNoPause || (ConsoleState - c_down < 2)) &&
       (!demoplayback)))) &&
     ((!demorecording &&
      (((*(double *)(&DAT_009ba480 + (long)consoleplayer * 0x2a0) != 3.4028234663852886e+38 ||
        (NAN(*(double *)(&DAT_009ba480 + (long)consoleplayer * 0x2a0)))) &&
       (wipegamestate == gamestate)))))) {
    S_PauseSound((level.flags2 >> 0xc & 1) == 0,false);
    return true;
  }
  return false;
}

Assistant:

bool P_CheckTickerPaused ()
{
	// pause if in menu or console and at least one tic has been run
	if ( !netgame
		 && gamestate != GS_TITLELEVEL
		 && ((menuactive != MENU_Off && menuactive != MENU_OnNoPause) ||
			 ConsoleState == c_down || ConsoleState == c_falling)
		 && !demoplayback
		 && !demorecording
		 && players[consoleplayer].viewz != NO_VALUE
		 && wipegamestate == gamestate)
	{
		S_PauseSound (!(level.flags2 & LEVEL2_PAUSE_MUSIC_IN_MENUS), false);
		return true;
	}
	return false;
}